

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImDrawList::PushClipRect
          (ImDrawList *this,ImVec2 cr_min,ImVec2 cr_max,bool intersect_with_current_clip_rect)

{
  int *piVar1;
  int iVar2;
  ImVec4 *pIVar3;
  ImGuiContext *pIVar4;
  long lVar5;
  ImVec4 *__dest;
  int iVar6;
  int iVar7;
  undefined7 in_register_00000031;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  
  pIVar4 = GImGui;
  fVar8 = cr_min.x;
  fVar9 = cr_min.y;
  fVar10 = cr_max.x;
  fVar11 = cr_max.y;
  fVar12 = fVar11;
  if (((int)CONCAT71(in_register_00000031,intersect_with_current_clip_rect) != 0) &&
     (lVar5 = (long)(this->_ClipRectStack).Size, lVar5 != 0)) {
    pIVar3 = (this->_ClipRectStack).Data;
    fVar12 = pIVar3[lVar5 + -1].x;
    if (pIVar3[lVar5 + -1].x <= fVar8) {
      fVar12 = fVar8;
    }
    fVar8 = pIVar3[lVar5 + -1].y;
    if (pIVar3[lVar5 + -1].y <= fVar9) {
      fVar8 = fVar9;
    }
    fVar13 = pIVar3[lVar5 + -1].z;
    if (fVar10 <= pIVar3[lVar5 + -1].z) {
      fVar13 = fVar10;
    }
    fVar9 = fVar8;
    fVar8 = fVar12;
    fVar10 = fVar13;
    fVar12 = pIVar3[lVar5 + -1].w;
    if (fVar11 <= pIVar3[lVar5 + -1].w) {
      fVar12 = fVar11;
    }
  }
  iVar7 = (this->_ClipRectStack).Size;
  iVar2 = (this->_ClipRectStack).Capacity;
  if (iVar7 == iVar2) {
    iVar7 = iVar7 + 1;
    if (iVar2 == 0) {
      iVar6 = 8;
    }
    else {
      iVar6 = iVar2 / 2 + iVar2;
    }
    if (iVar7 < iVar6) {
      iVar7 = iVar6;
    }
    if (iVar2 < iVar7) {
      piVar1 = &(GImGui->IO).MetricsAllocs;
      *piVar1 = *piVar1 + 1;
      __dest = (ImVec4 *)(*(pIVar4->IO).MemAllocFn)((long)iVar7 << 4);
      pIVar3 = (this->_ClipRectStack).Data;
      if (pIVar3 != (ImVec4 *)0x0) {
        memcpy(__dest,pIVar3,(long)(this->_ClipRectStack).Size << 4);
      }
      pIVar3 = (this->_ClipRectStack).Data;
      if (pIVar3 != (ImVec4 *)0x0) {
        piVar1 = &(GImGui->IO).MetricsAllocs;
        *piVar1 = *piVar1 + -1;
      }
      (*(GImGui->IO).MemFreeFn)(pIVar3);
      (this->_ClipRectStack).Data = __dest;
      (this->_ClipRectStack).Capacity = iVar7;
    }
  }
  pIVar3 = (this->_ClipRectStack).Data;
  iVar7 = (this->_ClipRectStack).Size;
  (this->_ClipRectStack).Size = iVar7 + 1;
  pIVar3[iVar7].x = fVar8;
  pIVar3[iVar7].y = fVar9;
  pIVar3[iVar7].z =
       (float)(~-(uint)(fVar10 <= fVar8) & (uint)fVar10 | -(uint)(fVar10 <= fVar8) & (uint)fVar8);
  pIVar3[iVar7].w =
       (float)(~-(uint)(fVar12 <= fVar9) & (uint)fVar12 | -(uint)(fVar12 <= fVar9) & (uint)fVar9);
  UpdateClipRect(this);
  return;
}

Assistant:

void ImDrawList::PushClipRect(ImVec2 cr_min, ImVec2 cr_max, bool intersect_with_current_clip_rect)
{
    ImVec4 cr(cr_min.x, cr_min.y, cr_max.x, cr_max.y);
    if (intersect_with_current_clip_rect && _ClipRectStack.Size)
    {
        ImVec4 current = _ClipRectStack.Data[_ClipRectStack.Size-1];
        if (cr.x < current.x) cr.x = current.x;
        if (cr.y < current.y) cr.y = current.y;
        if (cr.z > current.z) cr.z = current.z;
        if (cr.w > current.w) cr.w = current.w;
    }
    cr.z = ImMax(cr.x, cr.z);
    cr.w = ImMax(cr.y, cr.w);

    _ClipRectStack.push_back(cr);
    UpdateClipRect();
}